

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O0

void __thiscall ACustomBridge::Destroy(ACustomBridge *this)

{
  bool bVar1;
  AActor *pAVar2;
  AActor *thing;
  TThinkerIterator<AActor> it;
  ACustomBridge *this_local;
  
  it.super_FThinkerIterator._16_8_ = this;
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&thing,0x80);
  while (pAVar2 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&thing,false),
        pAVar2 != (AActor *)0x0) {
    bVar1 = TObjPtr<AActor>::operator==(&pAVar2->target,&this->super_AActor);
    if (bVar1) {
      (*(pAVar2->super_DThinker).super_DObject._vptr_DObject[4])();
    }
  }
  AActor::Destroy(&this->super_AActor);
  return;
}

Assistant:

void ACustomBridge::Destroy()
{
	// Hexen originally just set a flag to make the bridge balls remove themselves in A_BridgeOrbit.
	// But this is not safe with custom bridge balls that do not necessarily call that function.
	// So the best course of action is to look for all bridge balls here and destroy them ourselves.
	
	TThinkerIterator<AActor> it;
	AActor *thing;
	
	while ((thing = it.Next()))
	{
		if (thing->target == this)
		{
			thing->Destroy();
		}
	}
	Super::Destroy();
}